

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_union_ref_t * flatcc_builder_extend_union_vector(flatcc_builder_t *B,size_t count)

{
  int iVar1;
  size_t count_local;
  flatcc_builder_t *B_local;
  
  iVar1 = vector_count_add(B,(flatbuffers_uoffset_t)count,0x1fffffff);
  if (iVar1 == 0) {
    B_local = (flatcc_builder_t *)push_ds(B,(flatbuffers_uoffset_t)(count << 3));
  }
  else {
    B_local = (flatcc_builder_t *)0x0;
  }
  return (flatcc_builder_union_ref_t *)B_local;
}

Assistant:

flatcc_builder_union_ref_t *flatcc_builder_extend_union_vector(flatcc_builder_t *B, size_t count)
{
    if (vector_count_add(B, (uoffset_t)count, max_union_count)) {
        return 0;
    }
    return push_ds(B, (uoffset_t)(union_size * count));
}